

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void discrete_dist_test_streamable<trng::poisson_dist>(poisson_dist *d)

{
  param_type p_new;
  SourceLineInfo local_260;
  poisson_dist d_new;
  BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&> local_230;
  AssertionHandler catchAssertionHandler;
  StringRef local_1b8;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_198 [376];
  
  p_new.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_new.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_new.mu_ = 0.0;
  p_new.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  trng::operator<<(local_198,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)&str,&p_new);
  trng::poisson_dist::param_type::param_type(&d_new.P,&p_new);
  local_230.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
  local_230.super_ITransientExpression.m_isBinaryExpression = true;
  local_230.super_ITransientExpression.m_result = false;
  local_230.super_ITransientExpression._10_6_ = 0;
  local_260.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_260.line = 0x127;
  Catch::StringRef::StringRef(&local_1b8,"d == d_new");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_230,&local_260,local_1b8,Normal);
  local_260.file = (char *)d;
  Catch::ExprLhs<trng::poisson_dist_const&>::operator==
            (&local_230,(ExprLhs<trng::poisson_dist_const&> *)&local_260,&d_new);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_230.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_230.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&d_new.P.P_.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p_new.P_.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void discrete_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE(d == d_new);
}